

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::Loggers::setDefaultConfigurations
               (Configurations *configurations,bool reconfigureExistingLoggers)

{
  byte bVar1;
  element_type *this;
  byte in_SIL;
  undefined7 in_stack_00000008;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  this = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x235dae);
  el::base::Storage::registeredLoggers(this);
  el::base::RegisteredLoggers::setDefaultConfigurations
            ((RegisteredLoggers *)configurations,
             (Configurations *)CONCAT17(reconfigureExistingLoggers,in_stack_00000008));
  if ((bVar1 & 1) != 0) {
    reconfigureAllLoggers((Configurations *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void Loggers::setDefaultConfigurations(const Configurations& configurations, bool reconfigureExistingLoggers) {
  ELPP->registeredLoggers()->setDefaultConfigurations(configurations);
  if (reconfigureExistingLoggers) {
    Loggers::reconfigureAllLoggers(configurations);
  }
}